

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O1

void __thiscall
QHttp2ProtocolHandler::initReplyFromPushPromise
          (QHttp2ProtocolHandler *this,HttpMessagePair *message,QUrl *cacheKey)

{
  State SVar1;
  QDebug this_00;
  QHttp2Stream *stream;
  QLoggingCategory *pQVar2;
  ulong uVar3;
  QByteArray *_t1;
  ulong i;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QByteDataBuffer local_88;
  QDebug local_58;
  vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  stream = QHttp2Connection::promisedStream(*(QHttp2Connection **)(this + 0x38),cacheKey);
  QHttpNetworkReply::setHttp2WasUsed((QHttpNetworkReply *)message->second,true);
  pQVar2 = QtPrivateLogging::QT_HTTP2();
  if (((pQVar2->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_88.bufferCompleteSize = (qint64)pQVar2->name;
    local_88.buffers.d.d._0_4_ = 2;
    local_88.buffers.d.d._4_4_ = 0;
    local_88.buffers.d.ptr._0_4_ = 0;
    local_88.buffers.d.ptr._4_4_ = 0;
    local_88.buffers.d.size._0_4_ = 0;
    local_88.buffers.d.size._4_4_ = 0;
    QMessageLogger::debug();
    this_00.stream = local_58.stream;
    QVar4.m_data = (storage_type *)0x28;
    QVar4.m_size = (qsizetype)&local_50;
    QString::fromUtf8(QVar4);
    QTextStream::operator<<((QTextStream *)this_00.stream,(QString *)&local_50);
    if (local_50.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      LOCK();
      ((__atomic_base<int> *)
      &((local_50.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>.
         _M_impl.super__Vector_impl_data._M_start)->name).d.d)->_M_i =
           ((__atomic_base<int> *)
           &((local_50.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>.
              _M_impl.super__Vector_impl_data._M_start)->name).d.d)->_M_i + -1;
      UNLOCK();
      if (((__atomic_base<int> *)
          &((local_50.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>.
             _M_impl.super__Vector_impl_data._M_start)->name).d.d)->_M_i == 0) {
        QArrayData::deallocate
                  ((QArrayData *)
                   local_50.
                   super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>.
                   _M_impl.super__Vector_impl_data._M_start,2,0x10);
      }
    }
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QTextStream::operator<<((QTextStream *)local_58.stream,stream->m_streamID);
    if (*(QTextStream *)(local_58.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_58.stream,' ');
    }
    QDebug::~QDebug(&local_58);
  }
  SVar1 = stream->m_state;
  connectStream(this,message,stream);
  local_88.buffers.d.d._0_4_ = 0xaaaaaaaa;
  local_88.buffers.d.d._4_4_ = 0xaaaaaaaa;
  local_88.buffers.d.ptr._0_4_ = 0xaaaaaaaa;
  local_88.buffers.d.ptr._4_4_ = 0xaaaaaaaa;
  local_88.buffers.d.size._0_4_ = 0xaaaaaaaa;
  local_88.buffers.d.size._4_4_ = 0xaaaaaaaa;
  local_88.bufferCompleteSize = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  local_88.firstPos = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  QHttp2Stream::takeDownloadBuffer(&local_88,(QHttp2Stream *)stream);
  std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::vector
            (&local_50,&stream->m_headers);
  if (local_50.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_50.super__Vector_base<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    QHttp2Stream::headersReceived
              ((QHttp2Stream *)stream,&local_50,
               (undefined1 *)local_88.bufferCompleteSize == (undefined1 *)0x0 && SVar1 == Closed);
  }
  std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>::~vector(&local_50);
  if (((undefined1 *)local_88.bufferCompleteSize != (undefined1 *)0x0) &&
     (uVar3 = CONCAT44(local_88.buffers.d.size._4_4_,(undefined4)local_88.buffers.d.size),
     uVar3 != 0)) {
    i = 0;
    do {
      _t1 = QByteDataBuffer::operator[](&local_88,i);
      QHttp2Stream::dataReceived((QHttp2Stream *)stream,_t1,i == uVar3 - 1 && SVar1 == Closed);
      i = i + 1;
      uVar3 = CONCAT44(local_88.buffers.d.size._4_4_,(undefined4)local_88.buffers.d.size);
    } while (i < uVar3);
  }
  QArrayDataPointer<QByteArray>::~QArrayDataPointer((QArrayDataPointer<QByteArray> *)&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2ProtocolHandler::initReplyFromPushPromise(const HttpMessagePair &message,
                                                     const QUrl &cacheKey)
{
    QHttp2Stream *promise = h2Connection->promisedStream(cacheKey);
    Q_ASSERT(promise);
    Q_ASSERT(message.second);
    message.second->setHttp2WasUsed(true);

    qCDebug(QT_HTTP2) << "found cached/promised response on stream" << promise->streamID();

    const bool replyFinished = promise->state() == QHttp2Stream::State::Closed;

    connectStream(message, promise);

    // Now that we have connect()ed, re-emit signals so that the reply
    // can be processed as usual:

    QByteDataBuffer downloadBuffer = promise->takeDownloadBuffer();
    if (const auto &headers = promise->receivedHeaders(); !headers.empty())
        emit promise->headersReceived(headers, replyFinished && downloadBuffer.isEmpty());

    if (!downloadBuffer.isEmpty()) {
        for (qsizetype i = 0; i < downloadBuffer.bufferCount(); ++i) {
            const bool streamEnded = replyFinished && i == downloadBuffer.bufferCount() - 1;
            emit promise->dataReceived(downloadBuffer[i], streamEnded);
        }
    }
}